

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::HttpInputStream::Request> __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::readRequest(HttpInputStreamImpl *this)

{
  PromiseNode *pPVar1;
  AsyncInputStream *pAVar2;
  TransformPromiseNodeBase *pTVar3;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar4;
  _func_int **in_RSI;
  Promise<kj::HttpInputStream::Request> PVar5;
  Own<kj::_::PromiseNode> local_38;
  HttpInputStream local_28;
  AsyncInputStream *local_20;
  
  readMessageHeaders((HttpInputStreamImpl *)&stack0xffffffffffffffd8);
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,(Own<kj::_::PromiseNode> *)&stack0xffffffffffffffd8,
             _::
             TransformPromiseNode<kj::Maybe<kj::HttpHeaders::Request>,_kj::ArrayPtr<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1152:38),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  pAVar2 = local_20;
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045eb98;
  pTVar3[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
  local_38.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Maybe<kj::HttpHeaders::Request>,kj::ArrayPtr<char>,kj::(anonymous_namespace)::HttpInputStreamImpl::readRequestHeaders()::{lambda(kj::ArrayPtr<char>)#1},kj::_::PropagateException>>
        ::instance;
  local_38.ptr = (PromiseNode *)pTVar3;
  if (local_20 != (AsyncInputStream *)0x0) {
    local_20 = (AsyncInputStream *)0x0;
    (**(code **)*local_28._vptr_HttpInputStream)
              (local_28._vptr_HttpInputStream,
               pAVar2->_vptr_AsyncInputStream[-2] + (long)&pAVar2->_vptr_AsyncInputStream);
  }
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_38,
             _::
             TransformPromiseNode<kj::HttpInputStream::Request,_kj::Maybe<kj::HttpHeaders::Request>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1015:15),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  pPVar1 = local_38.ptr;
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045f3f0;
  pTVar3[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
  (this->super_HttpInputStream)._vptr_HttpInputStream =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpInputStream::Request,kj::Maybe<kj::HttpHeaders::Request>,kj::(anonymous_namespace)::HttpInputStreamImpl::readRequest()::{lambda(kj::Maybe<kj::HttpHeaders::Request>&&)#1},kj::_::PropagateException>>
        ::instance;
  this->inner = (AsyncInputStream *)pTVar3;
  pPVar4 = extraout_RDX;
  if ((TransformPromiseNodeBase *)local_38.ptr != (TransformPromiseNodeBase *)0x0) {
    local_38.ptr = (PromiseNode *)0x0;
    (**(local_38.disposer)->_vptr_Disposer)
              (local_38.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    pPVar4 = extraout_RDX_00;
  }
  PVar5.super_PromiseBase.node.ptr = pPVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::HttpInputStream::Request>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<Request> readRequest() override {
    return readRequestHeaders()
        .then([this](kj::Maybe<HttpHeaders::Request>&& maybeRequest) -> HttpInputStream::Request {
      auto request = KJ_REQUIRE_NONNULL(maybeRequest, "bad request");
      auto body = getEntityBody(HttpInputStreamImpl::REQUEST, request.method, 0, headers);

      return { request.method, request.url, headers, kj::mv(body) };
    });
  }